

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RewindLoopSetWithFollowFirstCont::Exec
          (RewindLoopSetWithFollowFirstCont *this,Matcher *matcher,Char *input,
          CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks)

{
  int iVar1;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Program *pPVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  LoopInfo *pLVar11;
  
  Matcher::QueryContinue(matcher,qcTicks);
  uVar8 = (ulong)*(uint *)&(this->super_Cont).field_0xc;
  pPVar6 = (matcher->program).ptr;
  if ((ulong)(pPVar6->rep).insts.instsLen < uVar8 + 0x38) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar3) goto LAB_00ef22ae;
    *puVar5 = 0;
    pPVar6 = (matcher->program).ptr;
  }
  lVar9 = *(long *)&pPVar6->rep;
  if (*(char *)(lVar9 + uVar8) != 'M') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar3) goto LAB_00ef22ae;
    *puVar5 = 0;
    pPVar6 = (matcher->program).ptr;
    lVar9 = *(long *)&pPVar6->rep;
  }
  iVar1 = *(int *)(lVar9 + 0x29 + uVar8);
  lVar10 = (long)iVar1;
  if ((lVar10 < 0) || (pPVar6->numLoops <= iVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar3) goto LAB_00ef22ae;
    *puVar5 = 0;
  }
  pLVar11 = (matcher->loopInfos).ptr;
  if (pLVar11[lVar10].number <= *(uint *)(lVar9 + 0x2d + uVar8)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x129d,"(loopInfo->number > begin->repeats.lower)",
                       "loopInfo->number > begin->repeats.lower");
    if (!bVar3) goto LAB_00ef22ae;
    *puVar5 = 0;
  }
  pLVar11 = pLVar11 + lVar10;
  this_00 = pLVar11->offsetsOfFollowFirst;
  if (this_00 ==
      (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    if (*(short *)(lVar9 + 0x36 + uVar8) != -1) goto LAB_00ef21d5;
    uVar4 = pLVar11->number - 1;
  }
  else if ((this_00->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
           count == 0) {
LAB_00ef21d5:
    uVar4 = *(uint *)(lVar9 + 0x2d + uVar8);
  }
  else {
    uVar4 = JsUtil::
            List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::RemoveAtEnd(this_00);
  }
  pLVar11->number = uVar4;
  uVar7 = *(uint *)(lVar9 + 0x2d + uVar8);
  if (uVar7 < uVar4) {
    uVar7 = uVar4;
  }
  pLVar11->number = uVar7;
  *inputOffset = uVar7 + pLVar11->startInputOffset;
  if (*(uint *)(lVar9 + 0x2d + uVar8) < pLVar11->number) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopSetWithFollowFirstCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  uVar4 = *(int *)&(this->super_Cont).field_0xc + 0x38;
  pPVar6 = (matcher->program).ptr;
  if ((pPVar6->rep).insts.instsLen <= uVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar3) {
LAB_00ef22ae:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pPVar6 = (matcher->program).ptr;
  }
  *instPointer = (pPVar6->rep).insts.insts.ptr + uVar4;
  return true;
}

Assistant:

inline bool RewindLoopSetWithFollowFirstCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        LoopSetWithFollowFirstInst* begin = matcher.L2I(LoopSetWithFollowFirst, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        // loopInfo->number is the number of iterations completed before trying follow
        Assert(loopInfo->number > begin->repeats.lower);
        // Try follow with fewer iterations

        if (loopInfo->offsetsOfFollowFirst == nullptr)
        {
            if (begin->followFirst != MaxUChar)
            {
                // We determined the first character in the follow set at compile time,
                // but didn't find a single match for it in the last iteration of the loop.
                // So, there is no benefit in backtracking.
                loopInfo->number = begin->repeats.lower; // stop backtracking
            }
            else
            {
                // We couldn't determine the first character in the follow set at compile time;
                // fall back to backtracking by one character at a time.
                loopInfo->number--;
            }
        }
        else
        {
            if (loopInfo->offsetsOfFollowFirst->Empty())
            {
                // We have already backtracked to the first offset where we matched the LoopSet's followFirst;
                // no point in backtracking more.
                loopInfo->number = begin->repeats.lower; // stop backtracking
            }
            else
            {
                // Backtrack to the previous offset where we matched the LoopSet's followFirst
                // We will be doing one unnecessary match. But, if we wanted to avoid it, we'd have
                // to propagate to the next Inst, that the first character is already matched.
                // Seems like an overkill to avoid one match.
                loopInfo->number = loopInfo->offsetsOfFollowFirst->RemoveAtEnd();
            }
        }

        // If loopInfo->number now is less than begins->repeats.lower, the loop
        // shouldn't match anything. In that case, stop backtracking.
        loopInfo->number = max(loopInfo->number, begin->repeats.lower);
        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number;

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopSetWithFollowFirstCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(LoopSetWithFollowFirstInst));
        return true; // STOP BACKTRACKING
    }